

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
__thiscall
Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar1;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RSI;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *unaff_retaddr;
  LhsNested in_stack_fffffffffffffff0;
  RhsNested in_stack_fffffffffffffff8;
  
  EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived(in_RDI);
  EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived(in_RSI);
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  PVar1.m_rhs = in_stack_fffffffffffffff8;
  PVar1.m_lhs = in_stack_fffffffffffffff0;
  return PVar1;
}

Assistant:

inline const Product<Derived, OtherDerived>
MatrixBase<Derived>::operator*(const MatrixBase<OtherDerived> &other) const
{
  // A note regarding the function declaration: In MSVC, this function will sometimes
  // not be inlined since DenseStorage is an unwindable object for dynamic
  // matrices and product types are holding a member to store the result.
  // Thus it does not help tagging this function with EIGEN_STRONG_INLINE.
  enum {
    ProductIsValid =  Derived::ColsAtCompileTime==Dynamic
                   || OtherDerived::RowsAtCompileTime==Dynamic
                   || int(Derived::ColsAtCompileTime)==int(OtherDerived::RowsAtCompileTime),
    AreVectors = Derived::IsVectorAtCompileTime && OtherDerived::IsVectorAtCompileTime,
    SameSizes = EIGEN_PREDICATE_SAME_MATRIX_SIZE(Derived,OtherDerived)
  };
  // note to the lost user:
  //    * for a dot product use: v1.dot(v2)
  //    * for a coeff-wise product use: v1.cwiseProduct(v2)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(AreVectors && SameSizes),
    INVALID_VECTOR_VECTOR_PRODUCT__IF_YOU_WANTED_A_DOT_OR_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTIONS)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(SameSizes && !AreVectors),
    INVALID_MATRIX_PRODUCT__IF_YOU_WANTED_A_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTION)
  EIGEN_STATIC_ASSERT(ProductIsValid || SameSizes, INVALID_MATRIX_PRODUCT)
#ifdef EIGEN_DEBUG_PRODUCT
  internal::product_type<Derived,OtherDerived>::debug();
#endif

  return Product<Derived, OtherDerived>(derived(), other.derived());
}